

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1540::run(TestCase1540 *this)

{
  Builder builder_00;
  bool bVar1;
  DebugExpression<bool> _kjCondition_4;
  DebugExpression<bool> _kjCondition;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  _kjCondition.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x609,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasTextField())",&_kjCondition);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField(&root);
  _kjCondition.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60a,ERROR,"\"failed: expected \" \"!(root.hasDataField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasDataField())",&_kjCondition);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  _kjCondition.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\", _kjCondition",
               (char (*) [42])"failed: expected !(root.hasStructField())",&_kjCondition);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List(&root);
  _kjCondition.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60c,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasInt32List())",&_kjCondition);
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)&_kjCondition);
  _kjCondition_4.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60e,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasTextField())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasTextField())",&_kjCondition_4);
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)&_kjCondition);
  _kjCondition_4.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60f,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasDataField())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasDataField())",&_kjCondition_4);
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)&_kjCondition)
  ;
  _kjCondition_4.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x610,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasStructField())\", _kjCondition",
               (char (*) [53])"failed: expected !(root.asReader().hasStructField())",&_kjCondition_4
              );
  }
  StructBuilder::asReader(&root._builder);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)&_kjCondition);
  _kjCondition_4.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x611,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasInt32List())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasInt32List())",&_kjCondition_4);
  }
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  _kjCondition.value = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextField(&root);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x615,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",&_kjCondition);
  }
  _kjCondition.value = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataField(&root);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x616,ERROR,"\"failed: expected \" \"root.hasDataField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasDataField()",&_kjCondition);
  }
  _kjCondition.value = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField(&root);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x617,ERROR,"\"failed: expected \" \"root.hasStructField()\", _kjCondition",
               (char (*) [39])"failed: expected root.hasStructField()",&_kjCondition);
  }
  _kjCondition.value = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List(&root);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x618,ERROR,"\"failed: expected \" \"root.hasInt32List()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasInt32List()",&_kjCondition);
  }
  StructBuilder::asReader(&root._builder);
  _kjCondition_4.value =
       capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)&_kjCondition);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.value) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61a,ERROR,"\"failed: expected \" \"root.asReader().hasTextField()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasTextField()",&_kjCondition_4);
  }
  StructBuilder::asReader(&root._builder);
  _kjCondition_4.value =
       capnproto_test::capnp::test::TestAllTypes::Reader::hasDataField((Reader *)&_kjCondition);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.value) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61b,ERROR,"\"failed: expected \" \"root.asReader().hasDataField()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasDataField()",&_kjCondition_4);
  }
  StructBuilder::asReader(&root._builder);
  _kjCondition_4.value =
       capnproto_test::capnp::test::TestAllTypes::Reader::hasStructField((Reader *)&_kjCondition);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.value) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61c,ERROR,
               "\"failed: expected \" \"root.asReader().hasStructField()\", _kjCondition",
               (char (*) [50])"failed: expected root.asReader().hasStructField()",&_kjCondition_4);
  }
  StructBuilder::asReader(&root._builder);
  _kjCondition_4.value =
       capnproto_test::capnp::test::TestAllTypes::Reader::hasInt32List((Reader *)&_kjCondition);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition_4.value) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61d,ERROR,"\"failed: expected \" \"root.asReader().hasInt32List()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasInt32List()",&_kjCondition_4);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}